

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::ParseVariableTag(Parser *this,TiXmlHandle *xml_handle)

{
  char *__s;
  string *psVar1;
  size_type sVar2;
  reference pvVar3;
  mapped_type *ppVVar4;
  reference pvVar5;
  bool bVar6;
  NamedVar *var_4;
  int i_4;
  NamedVar *var_3;
  int i_3;
  NamedVar *var_2;
  int i_2;
  StateVar *var_1;
  int i_1;
  StateVar *var;
  undefined1 local_428 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [8];
  NamedVar reward;
  NamedVar act;
  string local_2f0;
  undefined1 local_2d0 [8];
  NamedVar obs;
  undefined1 local_238 [8];
  StateVar curr_state;
  undefined1 local_158 [8];
  StateVar prev_state;
  undefined1 local_90 [8];
  string type;
  TiXmlElement *e_Var;
  allocator<char> local_51;
  string local_50;
  TiXmlHandle local_30;
  TiXmlHandle local_28;
  TiXmlElement *local_20;
  TiXmlElement *e_Variable;
  TiXmlHandle *xml_handle_local;
  Parser *this_local;
  
  e_Variable = (TiXmlElement *)xml_handle;
  xml_handle_local = (TiXmlHandle *)this;
  util::tinyxml::TiXmlHandle::FirstChild(&local_30,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_28,(char *)&local_30);
  local_20 = util::tinyxml::TiXmlHandle::ToElement(&local_28);
  bVar6 = local_20 != (TiXmlElement *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Cannot find Variable tag",&local_51);
  Ensure(this,bVar6,&local_50,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  type.field_2._8_8_ = util::tinyxml::TiXmlNode::FirstChildElement(&local_20->super_TiXmlNode);
  while (type.field_2._8_8_ != 0) {
    __s = util::tinyxml::TiXmlNode::Value((TiXmlNode *)type.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,__s,(allocator<char> *)&prev_state.field_0xbf);
    std::allocator<char>::~allocator((allocator<char> *)&prev_state.field_0xbf);
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"StateVar");
    if (bVar6) {
      CreateStateVar((StateVar *)local_158,this,(TiXmlElement *)type.field_2._8_8_);
      psVar1 = StateVar::prev_name_abi_cxx11_((StateVar *)local_158);
      std::__cxx11::string::string((string *)&curr_state.observed_,(string *)psVar1);
      NamedVar::name((NamedVar *)local_158,(string *)&curr_state.observed_);
      std::__cxx11::string::~string((string *)&curr_state.observed_);
      std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::push_back
                (&this->prev_state_vars_,(value_type *)local_158);
      StateVar::StateVar((StateVar *)local_238,(StateVar *)local_158);
      psVar1 = StateVar::curr_name_abi_cxx11_((StateVar *)local_158);
      std::__cxx11::string::string((string *)(obs.name_.field_2._M_local_buf + 8),(string *)psVar1);
      NamedVar::name((NamedVar *)local_238,(string *)((long)&obs.name_.field_2 + 8));
      std::__cxx11::string::~string((string *)(obs.name_.field_2._M_local_buf + 8));
      std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::push_back
                (&this->curr_state_vars_,(value_type *)local_238);
      StateVar::~StateVar((StateVar *)local_238);
      StateVar::~StateVar((StateVar *)local_158);
    }
    else {
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"ObsVar");
      if (bVar6) {
        CreateObsVar((NamedVar *)local_2d0,this,(TiXmlElement *)type.field_2._8_8_);
        std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                  (&this->obs_vars_,(value_type *)local_2d0);
        NamedVar::~NamedVar((NamedVar *)local_2d0);
      }
      else {
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"ActionVar");
        if (bVar6) {
          sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size
                            (&this->action_vars_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,"Only one action variable is allowed!",
                     (allocator<char> *)(act.name_.field_2._M_local_buf + 0xf));
          Ensure(this,sVar2 == 0,&local_2f0,(TiXmlBase *)0x0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(act.name_.field_2._M_local_buf + 0xf));
          CreateActionVar((NamedVar *)((long)&reward.name_.field_2 + 8),this,
                          (TiXmlElement *)type.field_2._8_8_);
          std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                    (&this->action_vars_,(value_type *)((long)&reward.name_.field_2 + 8));
          NamedVar::~NamedVar((NamedVar *)((long)&reward.name_.field_2 + 8));
        }
        else {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"RewardVar");
          if (bVar6) {
            CreateRewardVar((NamedVar *)local_3e8,this,(TiXmlElement *)type.field_2._8_8_);
            std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::push_back
                      (&this->reward_vars_,(value_type *)local_3e8);
            NamedVar::~NamedVar((NamedVar *)local_3e8);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_428,"Unknown XML tag: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
            std::operator+(&local_408,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_428," encountered");
            Ensure(this,false,&local_408,(TiXmlBase *)type.field_2._8_8_);
            std::__cxx11::string::~string((string *)&local_408);
            std::__cxx11::string::~string((string *)local_428);
          }
        }
      }
    }
    type.field_2._8_8_ = (size_type)util::tinyxml::TiXmlNode::NextSiblingElement(type.field_2._8_8_)
    ;
    std::__cxx11::string::~string((string *)local_90);
  }
  for (var._4_4_ = 0;
      sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                        (&this->prev_state_vars_), (ulong)(long)var._4_4_ < sVar2;
      var._4_4_ = var._4_4_ + 1) {
    pvVar3 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->prev_state_vars_,(long)var._4_4_);
    psVar1 = NamedVar::name_abi_cxx11_(&pvVar3->super_NamedVar);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,psVar1);
    *ppVVar4 = (mapped_type)pvVar3;
  }
  for (var_1._4_4_ = 0;
      sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                        (&this->curr_state_vars_), (ulong)(long)var_1._4_4_ < sVar2;
      var_1._4_4_ = var_1._4_4_ + 1) {
    pvVar3 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->curr_state_vars_,(long)var_1._4_4_);
    psVar1 = NamedVar::name_abi_cxx11_(&pvVar3->super_NamedVar);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,psVar1);
    *ppVVar4 = (mapped_type)pvVar3;
  }
  for (var_2._4_4_ = 0;
      sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size
                        (&this->obs_vars_), (ulong)(long)var_2._4_4_ < sVar2;
      var_2._4_4_ = var_2._4_4_ + 1) {
    pvVar5 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)var_2._4_4_);
    psVar1 = NamedVar::name_abi_cxx11_(pvVar5);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,psVar1);
    *ppVVar4 = &pvVar5->super_Variable;
  }
  for (var_3._4_4_ = 0;
      sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size
                        (&this->action_vars_), (ulong)(long)var_3._4_4_ < sVar2;
      var_3._4_4_ = var_3._4_4_ + 1) {
    pvVar5 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->action_vars_,(long)var_3._4_4_);
    psVar1 = NamedVar::name_abi_cxx11_(pvVar5);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,psVar1);
    *ppVVar4 = &pvVar5->super_Variable;
  }
  for (var_4._4_4_ = 0;
      sVar2 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size
                        (&this->reward_vars_), (ulong)(long)var_4._4_4_ < sVar2;
      var_4._4_4_ = var_4._4_4_ + 1) {
    pvVar5 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->reward_vars_,(long)var_4._4_4_);
    psVar1 = NamedVar::name_abi_cxx11_(pvVar5);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,psVar1);
    *ppVVar4 = &pvVar5->super_Variable;
  }
  return;
}

Assistant:

void Parser::ParseVariableTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_Variable = xml_handle.FirstChild("pomdpx").FirstChild(
		"Variable").ToElement();

	Ensure(e_Variable != NULL, "Cannot find Variable tag");

	TiXmlElement* e_Var = e_Variable->FirstChildElement();
	while (e_Var != 0) {
		string type = e_Var->Value();
		if (type == "StateVar") {
			StateVar prev_state = CreateStateVar(e_Var);
			prev_state.name(prev_state.prev_name());
			prev_state_vars_.push_back(prev_state);

			StateVar curr_state = prev_state;
			curr_state.name(prev_state.curr_name());
			curr_state_vars_.push_back(curr_state);
		} else if (type == "ObsVar") {
			ObsVar obs = CreateObsVar(e_Var);
			obs_vars_.push_back(obs);
		} else if (type == "ActionVar") {
			Ensure(action_vars_.size() == 0,
				"Only one action variable is allowed!");

			ActionVar act = CreateActionVar(e_Var);
			action_vars_.push_back(act);
		} else if (type == "RewardVar") {
			RewardVar reward = CreateRewardVar(e_Var);
			reward_vars_.push_back(reward);
		} else {
			Ensure(false, "Unknown XML tag: " + type + " encountered", e_Var);
		}

		e_Var = e_Var->NextSiblingElement();
	}

	for (int i = 0; i < prev_state_vars_.size(); i++) {
		StateVar& var = prev_state_vars_[i];
		variables_[var.name()] = &var;
	}
	for (int i = 0; i < curr_state_vars_.size(); i++) {
		StateVar& var = curr_state_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < obs_vars_.size(); i++) {
		ObsVar& var = obs_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < action_vars_.size(); i++) {
		ActionVar& var = action_vars_[i];
		variables_[var.name()] = &var;
	}

	for (int i = 0; i < reward_vars_.size(); i++) {
		RewardVar& var = reward_vars_[i];
		variables_[var.name()] = &var;
	}
}